

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::LowMidHighCloudGroup>
metaf::LowMidHighCloudGroup::parse
          (string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  _Optional_base<metaf::LowMidHighCloudGroup,_true,_true> _Var1;
  bool bVar2;
  int iVar3;
  LowLayer LVar4;
  MidLayer MVar5;
  HighLayer HVar6;
  char *pcVar7;
  optional<metaf::LowMidHighCloudGroup> *this;
  int in_ESI;
  LowMidHighCloudGroup result;
  HighLayer highLayer;
  MidLayer midLayer;
  LowLayer lowLayer;
  smatch match;
  optional<metaf::LowMidHighCloudGroup> notRecognised;
  undefined4 in_stack_fffffffffffffed8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  match_flag_type in_stack_fffffffffffffeec;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  flag_type in_stack_ffffffffffffff14;
  MidLayer in_stack_ffffffffffffff18;
  HighLayer in_stack_ffffffffffffff1c;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff20;
  string local_b8 [36];
  MidLayer local_94;
  string local_90 [32];
  LowLayer local_70;
  undefined4 local_6c;
  undefined8 local_38;
  undefined8 local_30;
  int local_1c;
  undefined8 local_10;
  undefined8 local_8;
  
  local_1c = in_ESI;
  std::optional<metaf::LowMidHighCloudGroup>::optional
            ((optional<metaf::LowMidHighCloudGroup> *)0x26379b);
  if (parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
      rgx_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                 ::rgx_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                    ::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                           ::rgx_abi_cxx11_);
    }
  }
  if (local_1c == 4) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results(in_stack_fffffffffffffee0);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_ffffffffffffff00,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    if (bVar2) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
            (size_type)in_stack_fffffffffffffee0);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      LVar4 = lowLayerFromChar(*pcVar7);
      std::__cxx11::string::~string(local_90);
      local_70 = LVar4;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
            (size_type)in_stack_fffffffffffffee0);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_b8);
      MVar5 = midLayerFromChar(*pcVar7);
      std::__cxx11::string::~string(local_b8);
      local_94 = MVar5;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)CONCAT44(MVar5,in_stack_fffffffffffffee8),(size_type)in_stack_fffffffffffffee0);
      this = (optional<metaf::LowMidHighCloudGroup> *)
             std::__cxx11::string::operator[]((ulong)&stack0xffffffffffffff20);
      HVar6 = highLayerFromChar(*(char *)&(this->
                                          super__Optional_base<metaf::LowMidHighCloudGroup,_true,_true>
                                          )._M_payload.
                                          super__Optional_payload_base<metaf::LowMidHighCloudGroup>.
                                          _M_payload);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      LowMidHighCloudGroup((LowMidHighCloudGroup *)&stack0xffffffffffffff14);
      std::optional<metaf::LowMidHighCloudGroup>::optional<metaf::LowMidHighCloudGroup,_true>
                (this,(LowMidHighCloudGroup *)CONCAT44(HVar6,in_stack_fffffffffffffed8));
    }
    else {
      local_10 = local_38;
      local_8 = local_30;
    }
    local_6c = 1;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x263a8e);
  }
  else {
    local_10 = local_38;
    local_8 = local_30;
  }
  _Var1._M_payload.super__Optional_payload_base<metaf::LowMidHighCloudGroup>._8_8_ = local_8;
  _Var1._M_payload.super__Optional_payload_base<metaf::LowMidHighCloudGroup>._M_payload._0_8_ =
       local_10;
  return (_Optional_base<metaf::LowMidHighCloudGroup,_true,_true>)
         (_Optional_base<metaf::LowMidHighCloudGroup,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::LowMidHighCloudGroup>;
}

Assistant:

std::optional<LowMidHighCloudGroup> LowMidHighCloudGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	std::optional<LowMidHighCloudGroup> notRecognised;
	static const std::regex rgx("8/([0-9/])([0-9/])([0-9/])");
	static const auto matchLowLayer = 1, matchMidLayer = 2, matchHighLayer = 3;

	if (reportPart != ReportPart::RMK) return notRecognised;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return notRecognised;

	const auto lowLayer = lowLayerFromChar(match.str(matchLowLayer)[0]);
	const auto midLayer = midLayerFromChar(match.str(matchMidLayer)[0]);
	const auto highLayer = highLayerFromChar(match.str(matchHighLayer)[0]);
	LowMidHighCloudGroup result;
	result.cloudLowLayer = lowLayer;
	result.cloudMidLayer = midLayer;
	result.cloudHighLayer = highLayer;
	return result;
}